

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O2

SUNErrCode
SUNHashMap_New(int64_t capacity,_func_SUNErrCode_SUNHashMapKeyValue_ptr *destroyKeyValue,
              SUNHashMap *map)

{
  SUNErrCode SVar1;
  SUNHashMap pSVar2;
  SUNStlVector_SUNHashMapKeyValue self;
  long lVar3;
  
  if (capacity < 1) {
    return -0x270d;
  }
  pSVar2 = (SUNHashMap)malloc(0x10);
  *map = pSVar2;
  self = SUNStlVector_SUNHashMapKeyValue_New(capacity,destroyKeyValue);
  if (self == (SUNStlVector_SUNHashMapKeyValue)0x0) {
    free(*map);
    SVar1 = -0x2704;
  }
  else {
    lVar3 = capacity + 1;
    do {
      lVar3 = lVar3 + -1;
      if (lVar3 == 0) {
        (*map)->buckets = self;
        return 0;
      }
      SVar1 = SUNStlVector_SUNHashMapKeyValue_PushBack(self,(SUNHashMapKeyValue)destroyKeyValue);
    } while (SVar1 == 0);
  }
  return SVar1;
}

Assistant:

SUNErrCode SUNHashMap_New(int64_t capacity,
                          SUNErrCode (*destroyKeyValue)(SUNHashMapKeyValue* kv_ptr),
                          SUNHashMap* map)
{
  if (capacity <= 0) { return SUN_ERR_ARG_OUTOFRANGE; }

  *map = NULL;
  *map = (SUNHashMap)malloc(sizeof(**map));

  if (!map) { return SUN_ERR_MALLOC_FAIL; }

  SUNStlVector_SUNHashMapKeyValue buckets =
    SUNStlVector_SUNHashMapKeyValue_New(capacity, destroyKeyValue);
  if (!buckets)
  {
    free(*map);
    return SUN_ERR_MALLOC_FAIL;
  }

  /* Initialize all buckets to NULL */
  for (int64_t i = 0; i < capacity; i++)
  {
    SUNErrCode err = SUNStlVector_SUNHashMapKeyValue_PushBack(buckets, NULL);
    if (err) { return err; };
  }

  (*map)->buckets = buckets;

  return SUN_SUCCESS;
}